

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O0

int Map_MatchNodeCut(Map_Man_t *p,Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,float fWorstLimit)

{
  int iVar1;
  Map_Match_t *pM2;
  float fVar2;
  int local_68;
  int local_64;
  int Counter;
  int i;
  Map_Super_t *pSuper;
  Map_Match_t *pMatch;
  Map_Match_t MatchBest;
  float fWorstLimit_local;
  int fPhase_local;
  Map_Cut_t *pCut_local;
  Map_Node_t *pNode_local;
  Map_Man_t *p_local;
  
  pM2 = pCut->M + fPhase;
  MatchBest.tArrive.Worst = fWorstLimit;
  MatchBest.AreaFlow = (float)fPhase;
  memcpy(&pMatch,pM2,0x28);
  _Counter = pM2->pSupers;
  local_68 = 0;
  do {
    if ((_Counter == (Map_Super_t *)0x0) || (p->nMatches = p->nMatches + 1, local_68 == 0x1e)) {
      memcpy(pM2,&pMatch,0x28);
      if (pM2->pSuperBest != (Map_Super_t *)0x0) {
        Map_TimeCutComputeArrival(pNode,pCut,(int)MatchBest.AreaFlow,3.4028235e+37);
        if ((p->fMappingMode == 2) || (p->fMappingMode == 3)) {
          fVar2 = Map_CutGetAreaDerefed(pCut,(int)MatchBest.AreaFlow);
          pM2->AreaFlow = fVar2;
        }
        else if (p->fMappingMode == 4) {
          fVar2 = Map_SwitchCutGetDerefed(pNode,pCut,(int)MatchBest.AreaFlow);
          pM2->AreaFlow = fVar2;
        }
        else {
          fVar2 = Map_CutGetAreaFlow(pCut,(int)MatchBest.AreaFlow);
          pM2->AreaFlow = fVar2;
        }
      }
      return 1;
    }
    pM2->pSuperBest = _Counter;
    for (local_64 = 0; local_64 < (int)(*(uint *)&_Counter->field_0x4 >> 0x1c);
        local_64 = local_64 + 1) {
      p->nPhases = p->nPhases + 1;
      pM2->uPhaseBest = pM2->uPhase ^ (uint)_Counter->uPhases[local_64];
      if (p->fMappingMode == 0) {
        Map_TimeCutComputeArrival(pNode,pCut,(int)MatchBest.AreaFlow,MatchBest.tArrive.Worst);
        if ((pM2->tArrive).Worst <= MatchBest.tArrive.Worst + p->fEpsilon) {
          fVar2 = Map_CutGetAreaFlow(pCut,(int)MatchBest.AreaFlow);
          pM2->AreaFlow = fVar2;
LAB_004ad94c:
          iVar1 = Map_MatchCompare(p,(Map_Match_t *)&pMatch,pM2,p->fMappingMode);
          if ((iVar1 != 0) && (memcpy(&pMatch,pM2,0x28), p->fMappingMode == 0)) {
            MatchBest.tArrive.Worst = MatchBest.tArrive.Rise;
          }
        }
      }
      else {
        if ((p->fMappingMode == 2) || (p->fMappingMode == 3)) {
          fVar2 = Map_CutGetAreaDerefed(pCut,(int)MatchBest.AreaFlow);
          pM2->AreaFlow = fVar2;
        }
        else if (p->fMappingMode == 4) {
          fVar2 = Map_SwitchCutGetDerefed(pNode,pCut,(int)MatchBest.AreaFlow);
          pM2->AreaFlow = fVar2;
        }
        else {
          fVar2 = Map_CutGetAreaFlow(pCut,(int)MatchBest.AreaFlow);
          pM2->AreaFlow = fVar2;
        }
        if ((pM2->AreaFlow <= MatchBest.tArrive.Fall + p->fEpsilon) &&
           (Map_TimeCutComputeArrival(pNode,pCut,(int)MatchBest.AreaFlow,MatchBest.tArrive.Worst),
           (pM2->tArrive).Worst <= MatchBest.tArrive.Worst + p->fEpsilon)) goto LAB_004ad94c;
      }
    }
    _Counter = _Counter->pNext;
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

int Map_MatchNodeCut( Map_Man_t * p, Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, float fWorstLimit )
{
    Map_Match_t MatchBest, * pMatch = pCut->M + fPhase;
    Map_Super_t * pSuper;
    int i, Counter;

    // save the current match of the cut
    MatchBest = *pMatch;
    // go through the supergates
    for ( pSuper = pMatch->pSupers, Counter = 0; pSuper; pSuper = pSuper->pNext, Counter++ )
    {
        p->nMatches++;
        // this is an attempt to reduce the runtime of matching and area 
        // at the cost of rare and very minor increase in delay
        // (the supergates are sorted by increasing area)
        if ( Counter == 30 )
           break;

        // go through different phases of the given match and supergate
        pMatch->pSuperBest = pSuper;
        for ( i = 0; i < (int)pSuper->nPhases; i++ )
        {
            p->nPhases++;
            // find the overall phase of this match
            pMatch->uPhaseBest = pMatch->uPhase ^ pSuper->uPhases[i];
            if ( p->fMappingMode == 0 )
            {
                // get the arrival time
                Map_TimeCutComputeArrival( pNode, pCut, fPhase, fWorstLimit );
                // skip the cut if the arrival times exceed the required times
                if ( pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
                    continue;
                // get the area (area flow)
                pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
            }
            else
            {
                // get the area (area flow)
                if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
                    pMatch->AreaFlow = Map_CutGetAreaDerefed( pCut, fPhase );
                else if ( p->fMappingMode == 4 )
                    pMatch->AreaFlow = Map_SwitchCutGetDerefed( pNode, pCut, fPhase );
                else 
                    pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
                // skip if the cut is too large
                if ( pMatch->AreaFlow > MatchBest.AreaFlow + p->fEpsilon )
                    continue;
                // get the arrival time
                Map_TimeCutComputeArrival( pNode, pCut, fPhase, fWorstLimit );
                // skip the cut if the arrival times exceed the required times
                if ( pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
                    continue;
            }

            // if the cut is non-trivial, compare it
            if ( Map_MatchCompare( p, &MatchBest, pMatch, p->fMappingMode ) )
            {
                MatchBest = *pMatch;
                // if we are mapping for delay, the worst-case limit should be reduced
                if ( p->fMappingMode == 0 )
                    fWorstLimit = MatchBest.tArrive.Worst;
            }
        }
    }
    // set the best match
    *pMatch = MatchBest;

    // recompute the arrival time and area (area flow) of this cut
    if ( pMatch->pSuperBest )
    {
        Map_TimeCutComputeArrival( pNode, pCut, fPhase, MAP_FLOAT_LARGE );
        if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
            pMatch->AreaFlow = Map_CutGetAreaDerefed( pCut, fPhase );
        else if ( p->fMappingMode == 4 )
            pMatch->AreaFlow = Map_SwitchCutGetDerefed( pNode, pCut, fPhase );
        else 
            pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
    }
    return 1;
}